

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

void sysbvm_jit_jumpRelative(sysbvm_bytecodeJit_t *jit,size_t targetPC)

{
  sysbvm_bytecodeJitPCRelocation_t relocation_00;
  size_t sVar1;
  sysbvm_bytecodeJitPCRelocation_t relocation;
  size_t relocationOffset;
  size_t sStack_18;
  uint8_t instruction [5];
  size_t targetPC_local;
  sysbvm_bytecodeJit_t *jit_local;
  
  relocationOffset._3_4_ = 0xe9;
  relocationOffset._7_1_ = 0;
  sStack_18 = targetPC;
  sVar1 = sysbvm_bytecodeJit_addBytes(jit,5,(uint8_t *)((long)&relocationOffset + 3));
  relocation_00.targetPC = sStack_18;
  relocation_00.offset = sVar1 - 4;
  relocation_00.addend = -4;
  sysbvm_bytecodeJit_addPCRelocation(jit,relocation_00);
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_jumpRelative(sysbvm_bytecodeJit_t *jit, size_t targetPC)
{
    uint8_t instruction[] = {
        0xE9, 0x00, 0x00, 0x00, 0x00,
    };

    size_t relocationOffset = sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction) - 4;
    sysbvm_bytecodeJitPCRelocation_t relocation = {
        .offset = relocationOffset,
        .targetPC = targetPC,
        .addend = -4,
    };
    sysbvm_bytecodeJit_addPCRelocation(jit, relocation);
}